

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::EncoderFeatureIndex::reopen
          (EncoderFeatureIndex *this,char *filename,char *dic_charset,
          vector<double,_std::allocator<double>_> *alpha,Param *param)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  long *plVar5;
  size_t sVar6;
  ulong uVar7;
  ostream *poVar8;
  size_t sVar9;
  scoped_fixed_array<char,_8192> *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_long>_>::value,_pair<iterator,_bool>_>
  _Var10;
  string feature;
  Iconv iconv;
  string model_charset;
  char *column [8];
  scoped_fixed_array<char,_8192> buf;
  ifstream ifs;
  value_type_conflict5 *in_stack_fffffffffffff988;
  scoped_fixed_array<char,_8192> *in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  in_stack_fffffffffffff9a0;
  ostream *in_stack_fffffffffffff9b8;
  ostream *in_stack_fffffffffffff9c0;
  ostream *in_stack_fffffffffffff9c8;
  ostream *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  die local_35a;
  allocator local_359;
  string local_358 [32];
  byte local_338;
  die local_337;
  byte local_336;
  die local_335;
  byte local_334;
  die local_333;
  byte local_332;
  die local_331;
  Iconv local_330;
  byte local_31d;
  die local_31c;
  byte local_31b;
  die local_31a;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [38];
  byte local_2ca;
  die local_2c9;
  string local_2c8 [32];
  char *local_2a8;
  char *local_2a0;
  scoped_fixed_array<char,_8192> local_260;
  undefined4 local_248;
  long local_238 [66];
  scoped_fixed_array<char,_8192> *local_28;
  char *local_20;
  char *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  std::ifstream::ifstream(local_238,local_18,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_238 + *(long *)(local_238[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_fffffffffffff990);
    std::__cxx11::string::string(local_2c8);
    while( true ) {
      pcVar4 = scoped_fixed_array<char,_8192>::get(&local_260);
      scoped_fixed_array<char,_8192>::size(&local_260);
      plVar5 = (long *)std::istream::getline((char *)local_238,(long)pcVar4);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      pcVar4 = scoped_fixed_array<char,_8192>::get(&local_260);
      sVar6 = strlen(pcVar4);
      if (sVar6 == 0) break;
      local_2ca = 0;
      scoped_fixed_array<char,_8192>::get(&local_260);
      sVar9 = tokenize2<char**>((char *)in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                                (char **)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8
                               );
      if (sVar9 != 2) {
        die::die(&local_2c9);
        local_2ca = 1;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x27b);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"tokenize2(buf.get(), \":\", column, 2) == 2");
        poVar8 = std::operator<<(poVar8,"] ");
        poVar8 = std::operator<<(poVar8,"format error: ");
        pcVar4 = scoped_fixed_array<char,_8192>::get(&local_260);
        poVar8 = std::operator<<(poVar8,pcVar4);
        die::operator&(&local_2c9,poVar8);
      }
      if ((local_2ca & 1) != 0) {
        die::~die((die *)0x1ecc96);
      }
      pcVar4 = local_2a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,pcVar4,&local_2f1);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      if (bVar2) {
        std::__cxx11::string::operator=(local_2c8,local_2a0 + 1);
      }
      else {
        pcVar4 = local_2a0 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,pcVar4,&local_319);
        Param::set<std::__cxx11::string>
                  ((Param *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                   in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                   SUB81((ulong)in_stack_fffffffffffffa38 >> 0x38,0));
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
      }
    }
    local_31b = 0;
    if (local_20 == (char *)0x0) {
      die::die(&local_31a);
      local_31b = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x284);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"dic_charset");
      poVar8 = std::operator<<(poVar8,"] ");
      die::operator&(&local_31a,poVar8);
    }
    if ((local_31b & 1) != 0) {
      die::~die((die *)0x1ecfc5);
    }
    uVar7 = std::__cxx11::string::empty();
    local_31d = 0;
    if ((uVar7 & 1) != 0) {
      die::die(&local_31c);
      local_31d = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x285);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"!model_charset.empty()");
      poVar8 = std::operator<<(poVar8,"] ");
      poVar8 = std::operator<<(poVar8,"charset is empty");
      die::operator&(&local_31c,poVar8);
    }
    if ((local_31d & 1) != 0) {
      die::~die((die *)0x1ed0fb);
    }
    Iconv::Iconv(&local_330);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_332 = 0;
    uVar3 = Iconv::open(&local_330,pcVar4,(int)local_20);
    if ((uVar3 & 1) == 0) {
      die::die(&local_331);
      local_332 = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x288);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"iconv.open(model_charset.c_str(), dic_charset)");
      poVar8 = std::operator<<(poVar8,"] ");
      poVar8 = std::operator<<(poVar8,"cannot create model from=");
      poVar8 = std::operator<<(poVar8,local_2c8);
      poVar8 = std::operator<<(poVar8," to=");
      poVar8 = std::operator<<(poVar8,local_20);
      die::operator&(&local_331,poVar8);
    }
    if ((local_332 & 1) != 0) {
      die::~die((die *)0x1ed2c6);
    }
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1ed2d3);
    local_334 = 0;
    if (in_RDI[0x2c] != 0) {
      die::die(&local_333);
      local_334 = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x28d);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"maxid_ == 0");
      poVar8 = std::operator<<(poVar8,"] ");
      die::operator&(&local_333,poVar8);
    }
    if ((local_334 & 1) != 0) {
      die::~die((die *)0x1ed3ef);
    }
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)0x1ed403);
    local_336 = 0;
    if (!bVar2) {
      die::die(&local_335);
      local_336 = 1;
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x28e);
      poVar8 = std::operator<<(poVar8,") [");
      poVar8 = std::operator<<(poVar8,"dic_.empty()");
      poVar8 = std::operator<<(poVar8,"] ");
      die::operator&(&local_335,poVar8);
    }
    if ((local_336 & 1) != 0) {
      die::~die((die *)0x1ed510);
    }
    while( true ) {
      pcVar4 = scoped_fixed_array<char,_8192>::get(&local_260);
      scoped_fixed_array<char,_8192>::size(&local_260);
      plVar5 = (long *)std::istream::getline((char *)local_238,(long)pcVar4);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (!bVar2) break;
      local_338 = 0;
      scoped_fixed_array<char,_8192>::get(&local_260);
      sVar9 = tokenize2<char**>((char *)in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                                (char **)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8
                               );
      if (sVar9 != 2) {
        die::die(&local_337);
        local_338 = 1;
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x291);
        poVar8 = std::operator<<(poVar8,") [");
        poVar8 = std::operator<<(poVar8,"tokenize2(buf.get(), \"\\t\", column, 2) == 2");
        poVar8 = std::operator<<(poVar8,"] ");
        poVar8 = std::operator<<(poVar8,"format error: ");
        pcVar4 = scoped_fixed_array<char,_8192>::get(&local_260);
        poVar8 = std::operator<<(poVar8,pcVar4);
        die::operator&(&local_337,poVar8);
      }
      if ((local_338 & 1) != 0) {
        die::~die((die *)0x1ed736);
      }
      pcVar4 = local_2a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,pcVar4,&local_359);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      bVar2 = Iconv::convert((Iconv *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
                             (string *)in_stack_fffffffffffff990);
      if (!bVar2) {
        die::die(&local_35a);
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        in_stack_fffffffffffff9d0 = std::operator<<(poVar8,"(");
        in_stack_fffffffffffff9c8 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9d0,0x294);
        in_stack_fffffffffffff9c0 = std::operator<<(in_stack_fffffffffffff9c8,") [");
        in_stack_fffffffffffff9b8 =
             std::operator<<(in_stack_fffffffffffff9c0,"iconv.convert(&feature)");
        poVar8 = std::operator<<(in_stack_fffffffffffff9b8,"] ");
        die::operator&(&local_35a,poVar8);
        die::~die((die *)0x1ed883);
      }
      in_RDI[0x2c] = in_RDI[0x2c] + 1;
      std::make_pair<std::__cxx11::string&,unsigned_long>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
                 (unsigned_long *)in_stack_fffffffffffff990);
      _Var10 = std::
               map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               ::insert<std::pair<std::__cxx11::string,unsigned_long>>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffff9a0._M_node,
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                           *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      in_stack_fffffffffffff9a0 = _Var10.first._M_node;
      in_stack_fffffffffffff99f = _Var10.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)0x1ed916);
      in_stack_fffffffffffff990 = local_28;
      atof(local_2a8);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 in_stack_fffffffffffff988);
      std::__cxx11::string::~string(local_358);
    }
    local_1 = 1;
    local_248 = 1;
    Iconv::~Iconv(&local_330);
    std::__cxx11::string::~string(local_2c8);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array(in_stack_fffffffffffff990);
  }
  else {
    local_1 = 0;
    local_248 = 1;
  }
  std::ifstream::~ifstream(local_238);
  return (bool)(local_1 & 1);
}

Assistant:

bool EncoderFeatureIndex::reopen(const char *filename,
                                 const char *dic_charset,
                                 std::vector<double> *alpha,
                                 Param *param) {
  close();
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    return false;
  }

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[8];

  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    } else {
      param->set<std::string>(column[0], column[1] + 1, true);
    }
  }

  CHECK_DIE(dic_charset);
  CHECK_DIE(!model_charset.empty()) << "charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(model_charset.c_str(), dic_charset))
      << "cannot create model from=" << model_charset
      << " to=" << dic_charset;

  alpha->clear();
  CHECK_DIE(maxid_ == 0);
  CHECK_DIE(dic_.empty());

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    dic_.insert(std::make_pair(feature, maxid_++));
    alpha->push_back(atof(column[0]));
  }

  return true;
}